

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9MLGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint Seed;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  Vec_Wrd_t *__ptr;
  uint local_44;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  local_44 = 10;
  bVar3 = false;
  Seed = 0;
LAB_00279fca:
  do {
    iVar4 = Extra_UtilGetopt(argc,argv,"WSbvh");
    iVar8 = globalUtilOptind;
    if (iVar4 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
LAB_0027a09e:
        Abc_Print(-1,pcVar6);
        goto LAB_0027a0aa;
      }
      Seed = atoi(argv[globalUtilOptind]);
      uVar5 = Seed;
    }
    else {
      if (0x61 < iVar4) {
        if (iVar4 == 0x62) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else {
          if (iVar4 != 0x76) goto LAB_0027a0aa;
          bVar3 = (bool)(bVar3 ^ 1);
        }
        goto LAB_00279fca;
      }
      if (iVar4 == -1) {
        pGVar1 = pAbc->pGia;
        if (pGVar1 == (Gia_Man_t *)0x0) {
          pcVar6 = "Abc_CommandAbc9MLGen(): There is no AIG.\n";
        }
        else {
          if (0 < pGVar1->nRegs) {
            Abc_Print(-1,"Abc_CommandAbc9MLGen(): This command works only for combinational AIGs.\n"
                     );
            return 0;
          }
          __ptr = pGVar1->vSimsPi;
          if (__ptr != (Vec_Wrd_t *)0x0) {
            if (__ptr->pArray != (word *)0x0) {
              free(__ptr->pArray);
              pGVar1->vSimsPi->pArray = (word *)0x0;
              __ptr = pGVar1->vSimsPi;
              if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_0027a1d8;
            }
            free(__ptr);
            pGVar1->vSimsPi = (Vec_Wrd_t *)0x0;
          }
LAB_0027a1d8:
          iVar8 = globalUtilOptind;
          iVar4 = argc - globalUtilOptind;
          if (argc == globalUtilOptind) {
            puts("Default file names will be used.");
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = argv[globalUtilOptind];
          }
          if (iVar4 == 1 || iVar8 == argc) {
            if (bVar2) {
              Gia_ManDumpFiles(pAbc->pGia,local_44,local_44,Seed,pcVar6);
            }
            else {
              Gia_ManDumpPlaFiles(pAbc->pGia,local_44,local_44,Seed,pcVar6);
            }
            return 0;
          }
          pcVar6 = "File name is not given on the command line.\n";
        }
        iVar8 = -1;
        goto LAB_0027a167;
      }
      if (iVar4 != 0x57) goto LAB_0027a0aa;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0027a09e;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      uVar5 = local_44;
    }
    globalUtilOptind = iVar8 + 1;
    if ((int)uVar5 < 0) {
LAB_0027a0aa:
      Abc_Print(-2,"usage: &mlgen [-WS num] [-bvh] <file>\n");
      Abc_Print(-2,"\t         generates data files for machine learning\n");
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-S num : the random seed for simulation data (num < 10000) [default = %d]\n",
                (ulong)Seed);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle using binary data files [default = %s]\n",pcVar6);
      if (!bVar3) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar6 = "\t<file> : file to store the simulation info\n";
      iVar8 = -2;
LAB_0027a167:
      Abc_Print(iVar8,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9MLGen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManDumpFiles( Gia_Man_t * p, int nCexesT, int nCexesV, int Seed, char * pFileName );
    extern void Gia_ManDumpPlaFiles( Gia_Man_t * p, int nCexesT, int nCexesV, int Seed, char * pFileName );
    int c, Seed = 0, nWords = 10, fBinData = 0, fVerbose = 0;
    char * pFileName = NULL;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WSbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            Seed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Seed < 0 )
                goto usage;
            break;
        case 'b':
            fBinData ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLGen(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLGen(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 )
        printf( "Default file names will be used.\n" );
    else
        pFileName = pArgvNew[0];
    if ( nArgcNew != 0 && nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    if ( fBinData )
        Gia_ManDumpFiles( pAbc->pGia, nWords, nWords, Seed, pFileName );
    else
        Gia_ManDumpPlaFiles( pAbc->pGia, nWords, nWords, Seed, pFileName );
    return 0;

usage:
    Abc_Print( -2, "usage: &mlgen [-WS num] [-bvh] <file>\n" );
    Abc_Print( -2, "\t         generates data files for machine learning\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", nWords );
    Abc_Print( -2, "\t-S num : the random seed for simulation data (num < 10000) [default = %d]\n", Seed );
    Abc_Print( -2, "\t-b     : toggle using binary data files [default = %s]\n", fBinData? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file to store the simulation info\n");
    return 1;
}